

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O2

void __thiscall ExtraData::printExtraData(ExtraData *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer puVar5;
  pointer pSVar6;
  int iVar7;
  uint uVar8;
  ostream *poVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_00;
  ExtraData *this_00;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  string local_6a0;
  ulong local_680;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_678;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_660;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_648;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_630;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_618;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_600;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_5e8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_5d0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_5b8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_5a0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_588;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_570;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_558;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_540;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_528;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_510;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_4f8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_4e0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_4c8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_4b0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_498;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_480;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_468;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_450;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_438;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_420;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_408;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3f0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3d8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3c0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_3a8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_390;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_378;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_360;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_348;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_330;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_318;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_300;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2e8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2d0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2b8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2a0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_288;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_270;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_258;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_240;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_210;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1e0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1b0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_198;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_180;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_150;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_120;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  TypedPropertyValue local_78;
  
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "_______________________ExtraData_________________________");
  std::endl<char,std::char_traits<char>>(poVar9);
  if (this->consolePropsIsSet == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"CONSOLE_PROP: ");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_120,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_120);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,"This value MUST be 204.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_120);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_138,
               &(this->CONSOLE_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_138);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_138);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"This value MUST be 0xA0000002.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"   FillAttributes:                  ");
    parseFillAttributes(this,false);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"   PopupFillAttributes:             ");
    parseFillAttributes(this,true);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar9 = std::operator<<((ostream *)&std::cout,"   ScreenBufferSizeX:               ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_150,
               &(this->CONSOLE_PROPS).ScreenBufferSizeX);
    iVar7 = Utils::lenTwoBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_150);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    poVar9 = std::operator<<(poVar9," characters");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_150);
    poVar9 = std::operator<<((ostream *)&std::cout,"   ScreenBufferSizeY:               ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_168,
               &(this->CONSOLE_PROPS).ScreenBufferSizeY);
    iVar7 = Utils::lenTwoBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_168);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    poVar9 = std::operator<<(poVar9," characters");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_168);
    poVar9 = std::operator<<((ostream *)&std::cout,"   WindowSizeX:                     ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_180,
               &(this->CONSOLE_PROPS).WindowSizeX);
    iVar7 = Utils::lenTwoBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_180);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    poVar9 = std::operator<<(poVar9," characters");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_180);
    poVar9 = std::operator<<((ostream *)&std::cout,"   WindowSizeY:                     ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198,
               &(this->CONSOLE_PROPS).WindowSizeY);
    iVar7 = Utils::lenTwoBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    poVar9 = std::operator<<(poVar9," characters");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_198);
    poVar9 = std::operator<<((ostream *)&std::cout,"   WindowOriginX:                   ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b0,
               &(this->CONSOLE_PROPS).WindowOriginX);
    iVar7 = Utils::lenTwoBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b0);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    poVar9 = std::operator<<(poVar9," pixels");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1b0);
    poVar9 = std::operator<<((ostream *)&std::cout,"   WindowOriginY:                   ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c8,
               &(this->CONSOLE_PROPS).WindowOriginY);
    iVar7 = Utils::lenTwoBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c8);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    poVar9 = std::operator<<(poVar9," pixels");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1c8);
    std::operator<<((ostream *)&std::cout,"   UNUSED1:                         ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e0,
               &(this->CONSOLE_PROPS).UNUSED1);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1e0);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"A value that is undefined and MUST be ignored.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"   UNUSED2:                         ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8,
               &(this->CONSOLE_PROPS).UNUSED2);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1f8);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"A value that is undefined and MUST be ignored.");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   FontSize:                        ");
    std::endl<char,std::char_traits<char>>(poVar9);
    puVar5 = (this->CONSOLE_PROPS).FontSize.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = *puVar5;
    uVar2 = puVar5[1];
    uVar3 = puVar5[2];
    uVar4 = puVar5[3];
    poVar9 = std::operator<<((ostream *)&std::cout,"       Font height:                 ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar8 << 8 | uVar2);
    poVar9 = std::operator<<(poVar9," pixels");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"       Font width:                  ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar3 << 8 | uVar4);
    poVar9 = std::operator<<(poVar9," pixels");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"   FontFamily:                      ");
    parseFontFamily(this);
    std::operator<<((ostream *)&std::cout,"   FontWeight:                      ");
    parseFontWeight(this);
    std::operator<<((ostream *)&std::cout,"   FaceName:                        ");
    Utils::print_vec_unicode(&(this->CONSOLE_PROPS).FaceName);
    std::operator<<((ostream *)&std::cout,"   CursorSize:                      ");
    parseCursorSize(this);
    std::operator<<((ostream *)&std::cout,"   FullScreen:                      ");
    parseFullScreen(this);
    std::operator<<((ostream *)&std::cout,"   QuickEdit:                       ");
    parseQuickEdit(this);
    std::operator<<((ostream *)&std::cout,"   InsertMode:                      ");
    parseInsertMode(this);
    std::operator<<((ostream *)&std::cout,"   AutoPosition:                    ");
    parseAutoPosition(this);
    poVar9 = std::operator<<((ostream *)&std::cout,"   HistoryBufferSize:               ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_210,
               &(this->CONSOLE_PROPS).HistoryBufferSize);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_210);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," characters");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_210);
    poVar9 = std::operator<<((ostream *)&std::cout,"   NumberOfHistoryBuffers:          ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_228,
               &(this->CONSOLE_PROPS).NumberOfHistoryBuffers);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_228);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_228);
    std::operator<<((ostream *)&std::cout,"   HistoryNoDup:                    ");
    parseHistoryNoDup(this);
    std::operator<<((ostream *)&std::cout,"   ColorTable:                      ");
    parseColorTable(this);
  }
  if (this->consoleFEIsSet == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"CONSOLE_FE_PROPS: ");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_240,
               &(this->CONSOLE_FE_PROPS).BlockSize);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_240);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,"This value MUST be 12.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_240);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_258,
               &(this->CONSOLE_FE_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_258);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_258);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"This value MUST be 0xA0000004.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"   CodePage:                        ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_270,
               &(this->CONSOLE_FE_PROPS).CodePage);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_270);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_270);
  }
  if (this->drownPropsIsSet == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"DARWIN_PROPS: ");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288,
               &(this->DARWIN_PROPS).BlockSize);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,"This value MUST be 788.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_288);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a0,
               &(this->DARWIN_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2a0);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"This value MUST be 0xA0000006.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"   DarwinDataAnsi:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2b8,
               &(this->DARWIN_PROPS).DarwinDataAnsi);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2b8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2b8);
    std::operator<<((ostream *)&std::cout,"   DarwinDataUnicode:               ");
    Utils::print_vec_unicode(&(this->DARWIN_PROPS).DarwinDataUnicode);
  }
  if (this->environmentPropsIsSet == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"ENVIRONMENT_PROPS: ");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2d0,
               &(this->ENVIRONMENT_PROPS).BlockSize);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2d0);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,"This value MUST be 788.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2d0);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2e8,
               &(this->ENVIRONMENT_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2e8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2e8);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"This value MUST be 0xA0000001.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"   TargetAnsi:                      ");
    Utils::print_vec_unicode(&(this->ENVIRONMENT_PROPS).TargetAnsi);
    std::operator<<((ostream *)&std::cout,"   TargetUnicode:                   ");
    Utils::print_vec_unicode(&(this->ENVIRONMENT_PROPS).TargetUnicode);
  }
  if (this->iconEnvironmentPropsIsSet == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"ICON_ENVIRONMENT_PROPS: ");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_300,
               &(this->ICON_ENVIRONMENT_PROPS).BlockSize);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_300);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,"This value MUST be 788.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_300);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_318,
               &(this->ICON_ENVIRONMENT_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_318);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_318);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"This value MUST be 0xA0000007.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"   TargetAnsi:                      ");
    Utils::print_vec_unicode(&(this->ICON_ENVIRONMENT_PROPS).TargetAnsi);
    std::operator<<((ostream *)&std::cout,"   TargetUnicode:                   ");
    Utils::print_vec_unicode(&(this->ICON_ENVIRONMENT_PROPS).TargetUnicode);
  }
  if (this->knownFolderPropsIsSet == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"KNOWN_FOLDER_PROPS: ");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_330,
               &(this->KNOWN_FOLDER_PROPS).BlockSize);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_330);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,"This value MUST be 28.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_330);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_348,
               &(this->KNOWN_FOLDER_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_348);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_348);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"This value MUST be 0xA000000B.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"   KnownFolderID:                   ");
    pvVar1 = &(this->KNOWN_FOLDER_PROPS).KnownFolderID;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_360,pvVar1);
    Utils::printSid((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_360,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_360);
    poVar9 = std::operator<<((ostream *)&std::cout," : ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_378,pvVar1);
    Utils::getClsidType_abi_cxx11_(&local_6a0,(Utils *)&local_378,vec);
    poVar9 = std::operator<<(poVar9,(string *)&local_6a0);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_378);
    poVar9 = std::operator<<((ostream *)&std::cout,"   Offset:                          ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_390,
               &(this->KNOWN_FOLDER_PROPS).Offset);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_390);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes.");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,
                             "Specifies the location of the ItemID of the first child segment of the IDList specified by KnownFolderID. "
                            );
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,
                             "This value is the offset, in bytes, into the link target IDList.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_390);
  }
  if (this->propertyStorePropsIsSet == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"PROPERTY_STORE_PROPS: ");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3a8,
               &(this->PROPERTY_STORE_PROPS).BlockSize);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3a8);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,"This value MUST be greater than or equal to 12.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3a8);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3c0,
               &(this->PROPERTY_STORE_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3c0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3c0);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"This value MUST be 0xA0000009.");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   PropertyStore:                   ");
    std::endl<char,std::char_traits<char>>(poVar9);
    uVar11 = 0;
    while( true ) {
      if ((ulong)(((long)(this->PROPERTY_STORE_PROPS).PropertyStore.
                         super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->PROPERTY_STORE_PROPS).PropertyStore.
                        super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x78) <= uVar11) break;
      poVar9 = std::operator<<((ostream *)&std::cout,"   Serialized Property Storage ");
      local_680 = uVar11 + 1;
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)local_680);
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&std::cout,"          StorageSize:              ");
      *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
           *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3d8,
                 &(this->PROPERTY_STORE_PROPS).PropertyStore.
                  super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar11].StorageSize);
      Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3d8);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9," bytes");
      std::endl<char,std::char_traits<char>>(poVar9);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3d8);
      std::operator<<((ostream *)&std::cout,"          Version:                  ");
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
                 &(this->PROPERTY_STORE_PROPS).PropertyStore.
                  super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar11].Version);
      Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_90);
      poVar9 = std::operator<<((ostream *)&std::cout,
                               (string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      poVar9 = std::operator<<(poVar9,"Has to be equal to 0x53505331.");
      std::endl<char,std::char_traits<char>>(poVar9);
      std::operator<<((ostream *)&std::cout,"          FormatID:                 ");
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
                 &(this->PROPERTY_STORE_PROPS).PropertyStore.
                  super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar11].FormatID);
      Utils::printSid((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a8);
      poVar9 = std::operator<<((ostream *)&std::cout," : ");
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3f0,
                 &(this->PROPERTY_STORE_PROPS).PropertyStore.
                  super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar11].FormatID);
      Utils::getClsidType_abi_cxx11_(&local_6a0,(Utils *)&local_3f0,vec_00);
      poVar9 = std::operator<<(poVar9,(string *)&local_6a0);
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_3f0);
      lVar12 = 0;
      for (uVar10 = 0;
          pSVar6 = (this->PROPERTY_STORE_PROPS).PropertyStore.
                   super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar10 < (ulong)(((long)*(pointer *)
                                   ((long)&pSVar6[uVar11].SerializedPropertyValue.
                                           super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                           ._M_impl + 8) -
                           *(long *)&pSVar6[uVar11].SerializedPropertyValue.
                                     super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                     ._M_impl.super__Vector_impl_data) / 0xa8); uVar10 = uVar10 + 1)
      {
        poVar9 = std::operator<<((ostream *)&std::cout,"          SerializedPropertyValue ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)uVar10 + 1);
        poVar9 = std::operator<<(poVar9,":");
        std::endl<char,std::char_traits<char>>(poVar9);
        poVar9 = std::operator<<((ostream *)&std::cout,"            ValueSize:              ");
        *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
             *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_408,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                              super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].
                              SerializedPropertyValue.
                              super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                              ._M_impl.super__Vector_impl_data + lVar12));
        Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_408);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9," bytes");
        std::endl<char,std::char_traits<char>>(poVar9);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_408);
        if (this->isStringNameStructInPropsStorage == true) {
          poVar9 = std::operator<<((ostream *)&std::cout,"            NameSize:               ");
          *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
               *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_420,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                                super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                SerializedPropertyValue.
                                super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                ._M_impl.super__Vector_impl_data + lVar12 + 0x18));
          Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_420);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9," bytes");
          std::endl<char,std::char_traits<char>>(poVar9);
          this_01 = &local_420;
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cout,"            Id:                     ");
          *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
               *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_438,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                                super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                SerializedPropertyValue.
                                super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                ._M_impl.super__Vector_impl_data + lVar12 + 0x18));
          Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_438);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::endl<char,std::char_traits<char>>(poVar9);
          this_01 = &local_438;
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(this_01);
        std::operator<<((ostream *)&std::cout,"            Reserved:               ");
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                              super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].
                              SerializedPropertyValue.
                              super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                              ._M_impl.super__Vector_impl_data + lVar12 + 0x30));
        Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_c0);
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 (string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
        poVar9 = std::operator<<(poVar9,"MUST be 0x00.");
        std::endl<char,std::char_traits<char>>(poVar9);
        if (this->isStringNameStructInPropsStorage == true) {
          std::operator<<((ostream *)&std::cout,"            Name:               ");
          Utils::print_vec_unicode
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                                super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                SerializedPropertyValue.
                                super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                                ._M_impl.super__Vector_impl_data + lVar12 + 0x48));
        }
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "            Value (TypedPropertyValue structure):");
        std::endl<char,std::char_traits<char>>(poVar9);
        std::operator<<((ostream *)&std::cout,"              Type:                 ");
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_450,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                              super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].
                              SerializedPropertyValue.
                              super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                              ._M_impl.super__Vector_impl_data + lVar12 + 0x60));
        uVar8 = Utils::vectTwoToUnsignedInt
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_450,0);
        PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue::TypedPropertyValue
                  (&local_78,
                   (TypedPropertyValue *)
                   (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                              super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].
                              SerializedPropertyValue.
                              super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                              ._M_impl.super__Vector_impl_data + lVar12 + 0x60));
        parseTypedPropertyValueTypeAndValue(this,true,uVar8,&local_78);
        PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue::~TypedPropertyValue
                  (&local_78);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_450);
        std::operator<<((ostream *)&std::cout,"              Padding:              ");
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   (*(long *)&(this->PROPERTY_STORE_PROPS).PropertyStore.
                              super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11].
                              SerializedPropertyValue.
                              super__Vector_base<ExtraData::PropertyStorePropsStruct::StringOrIntegerName,_std::allocator<ExtraData::PropertyStorePropsStruct::StringOrIntegerName>_>
                              ._M_impl.super__Vector_impl_data + lVar12 + 0x78));
        Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_d8);
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 (string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
        poVar9 = std::operator<<(poVar9,
                                 "MUST be set to zero, and any nonzero value SHOULD be rejected.");
        std::endl<char,std::char_traits<char>>(poVar9);
        lVar12 = lVar12 + 0xa8;
      }
      std::operator<<((ostream *)&std::cout,"          TerminalIdentifier:       ");
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0,
                 &(this->PROPERTY_STORE_PROPS).PropertyStore.
                  super__Vector_base<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage,_std::allocator<ExtraData::PropertyStorePropsStruct::SerializedPropertyStorage>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar11].TerminalIdentifier);
      Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_f0);
      uVar11 = local_680;
    }
    std::operator<<((ostream *)&std::cout,"   TerminalId:                      ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_468,
               &(this->PROPERTY_STORE_PROPS).TerminalId);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_468);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_468);
  }
  if (this->shimPropsIsSet == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"SHIM_PROPS: ");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_480,
               &(this->SHIM_PROPS).BlockSize);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_480);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,"This value MUST be greater than or equal to 136.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_480);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_498,
               &(this->SHIM_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_498);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_498);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"This value MUST be 0xA0000008.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"   LayerName:                       ");
    Utils::print_vec_unicode(&(this->SHIM_PROPS).LayerName);
  }
  if (this->sFolderPropsIsSet == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"SPECIAL_FOLDER_PROPS: ");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4b0,
               &(this->SPECIAL_FOLDER_PROPS).BlockSize);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4b0);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,"This value MUST be 16.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_4b0);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4c8,
               &(this->SPECIAL_FOLDER_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4c8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_4c8);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"This value MUST be 0xA0000005.");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   SpecialFolderID:                 ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    pvVar1 = &(this->SPECIAL_FOLDER_PROPS).SpecialFolderID;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4e0,pvVar1);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4e0);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," : ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_678,pvVar1);
    this_00 = (ExtraData *)0x0;
    uVar8 = Utils::vectFourBytesToUnsignedInt
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_678,0);
    getSpecialFolderType_abi_cxx11_(&local_6a0,this_00,uVar8);
    poVar9 = std::operator<<(poVar9,(string *)&local_6a0);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_678);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_4e0);
    poVar9 = std::operator<<((ostream *)&std::cout,"   Offset:                          ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4f8,
               &(this->SPECIAL_FOLDER_PROPS).Offset);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4f8);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes.");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,
                             "Specifies the location of the ItemID of the first child segment of the IDList specified by SpecialFolderID. "
                            );
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,
                             "This value is the offset, in bytes, into the link target IDList.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_4f8);
  }
  if (this->trackerPropsIsSet == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"TRACKER_PROPS: ");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_510,
               &(this->TRACKER_PROPS).BlockSize);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_510);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,"This value MUST be 96.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_510);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_528,
               &(this->TRACKER_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_528);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_528);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"This value MUST be 0xA0000003.");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   Length:                          ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_540,
               &(this->TRACKER_PROPS).Length);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_540);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,"This value MUST be 88 bytes.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_540);
    poVar9 = std::operator<<((ostream *)&std::cout,"   Version:                         ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_558,
               &(this->TRACKER_PROPS).Version);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_558);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_558);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"This value MUST be 0.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"   MachineID (NetBIOS name):        ");
    Utils::print_vec_unicode(&(this->TRACKER_PROPS).MachineID);
    poVar9 = std::operator<<((ostream *)&std::cout,"   Droid:                           ");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"     Droid volume identifier:       ");
    pvVar1 = &(this->TRACKER_PROPS).Droid;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_570,pvVar1);
    Utils::printSid((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_570,0x10);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_570);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"     Droid file identifier:         ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_588,pvVar1);
    Utils::printSid((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_588,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_588);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar9 = std::operator<<((ostream *)&std::cout,"     UUID Sequence number:          ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_5a0,pvVar1);
    Utils::vectTwoToUnsignedInt
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_5a0,0x18);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_5a0);
    std::operator<<((ostream *)&std::cout,"     Mac address:                   ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_5b8,pvVar1);
    Utils::printMacAddr((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_5b8,0x10);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_5b8);
    poVar9 = std::operator<<((ostream *)&std::cout,"   DroidBirth:                      ");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::operator<<((ostream *)&std::cout,"     Birth droid volume identifier: ");
    pvVar1 = &(this->TRACKER_PROPS).DroidBirth;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_5d0,pvVar1);
    Utils::printSid((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_5d0,0x10);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_5d0);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"     Birth droid file identifier:   ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_5e8,pvVar1);
    Utils::printSid((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_5e8,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_5e8);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  if (this->vistaAndAboveIDListPropsIsSet == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"VISTA_AND_ABOVE_IDLIST_PROPS: ");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   BlockSize:                       ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_600,
               &(this->VISTA_AND_ABOVE_IDLIST_PROPS).BlockSize);
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_600);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," bytes");
    poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<(poVar9,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar9 = std::operator<<(poVar9,"This value MUST be greater than or equal to 10.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_600);
    std::operator<<((ostream *)&std::cout,"   BlockSignature:                  ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_618,
               &(this->VISTA_AND_ABOVE_IDLIST_PROPS).BlockSignature);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_618);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_618);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar9 = std::operator<<(poVar9,"This value MUST be 0xA000000C.");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"   IDList: ");
    std::endl<char,std::char_traits<char>>(poVar9);
    lVar12 = 0;
    for (uVar11 = 0;
        uVar11 < (ulong)(((long)(this->VISTA_AND_ABOVE_IDLIST_PROPS).IDList.
                                super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->VISTA_AND_ABOVE_IDLIST_PROPS).IDList.
                               super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x30);
        uVar11 = uVar11 + 1) {
      poVar9 = std::operator<<((ostream *)&std::cout,"       ItemID ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)uVar11 + 1);
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&std::cout,"           ItemIDSize:              ");
      *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
           *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_630,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(((this->VISTA_AND_ABOVE_IDLIST_PROPS).IDList.
                           super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                           ._M_impl.super__Vector_impl_data._M_start)->ItemIDSize).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                 lVar12));
      iVar7 = Utils::lenTwoBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_630);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
      poVar9 = std::operator<<(poVar9," bytes");
      std::endl<char,std::char_traits<char>>(poVar9);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_630);
      std::operator<<((ostream *)&std::cout,"           Data:                    ");
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(((this->VISTA_AND_ABOVE_IDLIST_PROPS).IDList.
                           super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                           ._M_impl.super__Vector_impl_data._M_start)->Data).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                 lVar12));
      Utils::parseItemData((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_108);
      lVar12 = lVar12 + 0x30;
    }
    std::operator<<((ostream *)&std::cout,"           TerminalID:              ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_648,
               &(this->VISTA_AND_ABOVE_IDLIST_PROPS).TerminalID);
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_648);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_648);
  }
  std::operator<<((ostream *)&std::cout,"TerminalBlock:                      ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_660,&this->TerminalBlock)
  ;
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_660);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_660);
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::endl<char,std::char_traits<char>>(poVar9);
  return;
}

Assistant:

void ExtraData::printExtraData() {
    cout << "_______________________ExtraData_________________________" << endl;

    if (consolePropsIsSet) {
        /* CONSOLE_PROPS struct*/
        cout << "CONSOLE_PROP: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(CONSOLE_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 204." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(CONSOLE_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000002." << endl;
        cout << "   FillAttributes:                  "; ExtraData::parseFillAttributes(false); cout << endl;
        cout << "   PopupFillAttributes:             "; ExtraData::parseFillAttributes(true); cout << endl;
        cout << "   ScreenBufferSizeX:               " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.ScreenBufferSizeX) << " characters" << endl;
        cout << "   ScreenBufferSizeY:               " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.ScreenBufferSizeY) << " characters" << endl;
        cout << "   WindowSizeX:                     " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.WindowSizeX) << " characters" << endl;
        cout << "   WindowSizeY:                     " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.WindowSizeY) << " characters" << endl;
        cout << "   WindowOriginX:                   " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.WindowOriginX) << " pixels" << endl;
        cout << "   WindowOriginY:                   " << dec << Utils::lenTwoBytes(CONSOLE_PROPS.WindowOriginY) << " pixels" << endl;
        cout << "   UNUSED1:                         "; Utils::print_vec(CONSOLE_PROPS.UNUSED1);
            cout << Utils::defaultOffsetDocInfo << "A value that is undefined and MUST be ignored." << endl;
        cout << "   UNUSED2:                         "; Utils::print_vec(CONSOLE_PROPS.UNUSED2);
            cout << Utils::defaultOffsetDocInfo << "A value that is undefined and MUST be ignored." << endl;
       cout << "   FontSize:                        " << endl;
            int height  = ((CONSOLE_PROPS.FontSize[0] << 8) | CONSOLE_PROPS.FontSize[1]);
            int width = ((CONSOLE_PROPS.FontSize[2] << 8) | CONSOLE_PROPS.FontSize[3]);
            cout << "       Font height:                 " << dec << height << " pixels" << endl;
            cout << "       Font width:                  " << dec << width << " pixels" << endl;
        cout << "   FontFamily:                      "; ExtraData::parseFontFamily();
        cout << "   FontWeight:                      "; ExtraData::parseFontWeight();
        cout << "   FaceName:                        "; Utils::print_vec_unicode(CONSOLE_PROPS.FaceName);
        cout << "   CursorSize:                      "; ExtraData::parseCursorSize();
        cout << "   FullScreen:                      "; ExtraData::parseFullScreen();
        cout << "   QuickEdit:                       "; ExtraData::parseQuickEdit();
        cout << "   InsertMode:                      "; ExtraData::parseInsertMode();
        cout << "   AutoPosition:                    "; ExtraData::parseAutoPosition();
        cout << "   HistoryBufferSize:               " << dec << Utils::lenFourBytes(CONSOLE_PROPS.HistoryBufferSize) << " characters" << endl;
        cout << "   NumberOfHistoryBuffers:          " << dec << Utils::lenFourBytes(CONSOLE_PROPS.NumberOfHistoryBuffers) << endl;
        cout << "   HistoryNoDup:                    "; ExtraData::parseHistoryNoDup();
        // Сделан просто вывод в hex формате без перевода в название цвета (не понятно, почему 16 записеё и по 4 байта)
        cout << "   ColorTable:                      "; ExtraData::parseColorTable();
    }
    if (consoleFEIsSet) {
        /* CONSOLE_FE_PROPS struct*/
        cout << "CONSOLE_FE_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(CONSOLE_FE_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 12." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(CONSOLE_FE_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000004." << endl;
        cout << "   CodePage:                        "; Utils::print_vec(CONSOLE_FE_PROPS.CodePage);
    }
    if (drownPropsIsSet) {
        /* DARWIN_PROPS struct*/
        cout << "DARWIN_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(DARWIN_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 788." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(DARWIN_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000006." << endl;
        cout << "   DarwinDataAnsi:                  "; Utils::print_vec(DARWIN_PROPS.DarwinDataAnsi);
        cout << "   DarwinDataUnicode:               "; Utils::print_vec_unicode(DARWIN_PROPS.DarwinDataUnicode);
    }
    if (environmentPropsIsSet) {
        /* ENVIRONMENT_PROPS struct*/
        cout << "ENVIRONMENT_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(ENVIRONMENT_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 788." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(ENVIRONMENT_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000001." << endl;
        cout << "   TargetAnsi:                      "; Utils::print_vec_unicode(ENVIRONMENT_PROPS.TargetAnsi);
        cout << "   TargetUnicode:                   "; Utils::print_vec_unicode(ENVIRONMENT_PROPS.TargetUnicode);
    }
    if (iconEnvironmentPropsIsSet) { // Проверена
        /* ICON_ENVIRONMENT_PROPS struct*/
        cout << "ICON_ENVIRONMENT_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(ICON_ENVIRONMENT_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 788." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(ICON_ENVIRONMENT_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000007." << endl;
        cout << "   TargetAnsi:                      "; Utils::print_vec_unicode(ICON_ENVIRONMENT_PROPS.TargetAnsi);
        cout << "   TargetUnicode:                   "; Utils::print_vec_unicode(ICON_ENVIRONMENT_PROPS.TargetUnicode);
    }
    if (knownFolderPropsIsSet) { //Проверена
        /* KNOWN_FOLDER_PROPS struct*/
        cout << "KNOWN_FOLDER_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(KNOWN_FOLDER_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 28." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(KNOWN_FOLDER_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA000000B." << endl;
        cout << "   KnownFolderID:                   "; Utils::printSid(KNOWN_FOLDER_PROPS.KnownFolderID, 0);
            cout << " : " << Utils::getClsidType(KNOWN_FOLDER_PROPS.KnownFolderID) << endl;
        cout << "   Offset:                          " << dec << Utils::lenFourBytes(KNOWN_FOLDER_PROPS.Offset) << " bytes." << endl <<
            Utils::defaultOffsetDocInfo << "Specifies the location of the ItemID of the first child segment of the IDList specified by KnownFolderID. " << endl <<
            Utils::defaultOffsetDocInfo << "This value is the offset, in bytes, into the link target IDList." << endl;
    }
    if (propertyStorePropsIsSet) {
        /* PROPERTY_STORE_PROPS struct*/
        cout << "PROPERTY_STORE_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(PROPERTY_STORE_PROPS.BlockSize) << " bytes" << endl <<
        Utils::defaultOffsetDocInfo << "This value MUST be greater than or equal to 12." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(PROPERTY_STORE_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000009." << endl;
        cout << "   PropertyStore:                   " << endl;
        for (int j = 0; j < PROPERTY_STORE_PROPS.PropertyStore.size(); ++j) {
            cout << "   Serialized Property Storage " << j+1 << endl;
            cout << "          StorageSize:              " << dec << Utils::lenFourBytes(PROPERTY_STORE_PROPS.PropertyStore[j].StorageSize)
                 << " bytes" << endl;
            cout << "          Version:                  "; Utils::print_vec(PROPERTY_STORE_PROPS.PropertyStore[j].Version);
            cout << Utils::defaultOffsetDocInfo << "Has to be equal to 0x53505331." << endl;
            cout << "          FormatID:                 ";  Utils::printSid(PROPERTY_STORE_PROPS.PropertyStore[j].FormatID, 0);
            cout << " : " << Utils::getClsidType(PROPERTY_STORE_PROPS.PropertyStore[j].FormatID) << endl;

            for (int i = 0; i < PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue.size(); ++i) {
                cout << "          SerializedPropertyValue " << i + 1 << ":" << endl;
                cout << "            ValueSize:              " << dec <<
                     Utils::lenFourBytes(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].ValueSize)  << " bytes" << endl;
                if (isStringNameStructInPropsStorage) {
                    /* for StringName */
                    cout << "            NameSize:               "  << dec <<
                         Utils::lenFourBytes(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].NameSizeOrId) << " bytes" << endl;
                } else {
                    /* for IntegerName */
                    cout << "            Id:                     " << dec <<
                         Utils::lenFourBytes(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].NameSizeOrId) << endl;
                }
                cout << "            Reserved:               ";
                Utils::print_vec(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Reserved);
                    cout << Utils::defaultOffsetDocInfo << "MUST be 0x00." << endl;
                if (isStringNameStructInPropsStorage) {
                    /* for StringName */
                    cout << "            Name:               ";
                    Utils::print_vec_unicode(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Name);
                }
                cout << "            Value (TypedPropertyValue structure):" << endl;
                cout << "              Type:                 ";
                ExtraData::parseTypedPropertyValueTypeAndValue(true, Utils::vectTwoToUnsignedInt(
                                                    PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Value.Type, 0),
                                                    PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Value);
                cout << "              Padding:              ";
                Utils::print_vec(PROPERTY_STORE_PROPS.PropertyStore[j].SerializedPropertyValue[i].Value.Padding);
                cout << Utils::defaultOffsetDocInfo << "MUST be set to zero, and any nonzero value SHOULD be rejected." << endl;
            }
            cout << "          TerminalIdentifier:       ";
            Utils::print_vec(PROPERTY_STORE_PROPS.PropertyStore[j].TerminalIdentifier);
        }
        cout << "   TerminalId:                      "; Utils::print_vec(PROPERTY_STORE_PROPS.TerminalId);
    }
    if (shimPropsIsSet) {
        /* SHIM_PROPS struct*/
        cout << "SHIM_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(SHIM_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be greater than or equal to 136." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(SHIM_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000008." << endl;
        cout << "   LayerName:                       "; Utils::print_vec_unicode(SHIM_PROPS.LayerName);
    }
    if (sFolderPropsIsSet) { // Проверена
        /* SPECIAL_FOLDER_PROPS struct*/
        cout << "SPECIAL_FOLDER_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(SPECIAL_FOLDER_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 16." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(SPECIAL_FOLDER_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000005." << endl;
        cout << "   SpecialFolderID:                 " << dec << Utils::lenFourBytes(SPECIAL_FOLDER_PROPS.SpecialFolderID) <<  " : " <<
            ExtraData::getSpecialFolderType(Utils::vectFourBytesToUnsignedInt(SPECIAL_FOLDER_PROPS.SpecialFolderID, 0)) << endl;
        cout << "   Offset:                          " << dec << Utils::lenFourBytes(SPECIAL_FOLDER_PROPS.Offset) << " bytes." << endl <<
            Utils::defaultOffsetDocInfo << "Specifies the location of the ItemID of the first child segment of the IDList specified by SpecialFolderID. " << endl <<
            Utils::defaultOffsetDocInfo << "This value is the offset, in bytes, into the link target IDList." << endl;
    }
    if (trackerPropsIsSet) {
        /* TRACKER_PROPS struct*/
        cout << "TRACKER_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec << Utils::lenFourBytes(TRACKER_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 96." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(TRACKER_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA0000003." << endl;
        cout << "   Length:                          "  << dec << Utils::lenFourBytes(TRACKER_PROPS.Length) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be 88 bytes." << endl;
        cout << "   Version:                         " << dec << Utils::lenFourBytes(TRACKER_PROPS.Version) << endl;
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0." << endl;
        cout << "   MachineID (NetBIOS name):        "; Utils::print_vec_unicode(TRACKER_PROPS.MachineID);
        cout << "   Droid:                           " << endl;
        cout << "     Droid volume identifier:       "; Utils::printSid(TRACKER_PROPS.Droid, 16); cout << endl;
        cout << "     Droid file identifier:         "; Utils::printSid(TRACKER_PROPS.Droid, 0); cout << endl;
        cout << "     UUID Sequence number:          " << dec << Utils::vectTwoToUnsignedInt(TRACKER_PROPS.Droid, 24) << endl;
        cout << "     Mac address:                   "; Utils::printMacAddr(TRACKER_PROPS.Droid, 16);
        cout << "   DroidBirth:                      " << endl;
        cout << "     Birth droid volume identifier: "; Utils::printSid(TRACKER_PROPS.DroidBirth, 16); cout << endl;
        cout << "     Birth droid file identifier:   "; Utils::printSid(TRACKER_PROPS.DroidBirth, 0); cout << endl;
    }
    if (vistaAndAboveIDListPropsIsSet) {
        /* VISTA_AND_ABOVE_IDLIST_PROPS struct*/
        cout << "VISTA_AND_ABOVE_IDLIST_PROPS: " << endl;
        cout << "   BlockSize:                       " << dec
            << Utils::lenFourBytes(VISTA_AND_ABOVE_IDLIST_PROPS.BlockSize) << " bytes" << endl <<
            Utils::defaultOffsetDocInfo << "This value MUST be greater than or equal to 10." << endl;
        cout << "   BlockSignature:                  "; Utils::print_vec(VISTA_AND_ABOVE_IDLIST_PROPS.BlockSignature);
            cout << Utils::defaultOffsetDocInfo << "This value MUST be 0xA000000C." << endl;
        cout << "   IDList: " <<  endl;
        for(int i = 0; i < VISTA_AND_ABOVE_IDLIST_PROPS.IDList.size(); ++i){
            cout << "       ItemID " << i + 1 << endl;
            cout << "           ItemIDSize:              " << dec
                 << Utils::lenTwoBytes(VISTA_AND_ABOVE_IDLIST_PROPS.IDList[i].ItemIDSize) << " bytes" << endl;
            cout << "           Data:                    "; Utils::parseItemData(VISTA_AND_ABOVE_IDLIST_PROPS.IDList[i].Data);
        }
        cout << "           TerminalID:              "; Utils::print_vec(VISTA_AND_ABOVE_IDLIST_PROPS.TerminalID);
    }
    cout << "TerminalBlock:                      "; Utils::print_vec(TerminalBlock);
    cout << "_________________________________________________________" << endl;
}